

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::get_3(disp *this,int x,int y,int z)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  string local_68;
  string local_48;
  
  ts<int>(&local_48,x);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x132df3);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b8 = *puVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar4;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ts<int>(&local_68,y);
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < local_68._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_68._M_string_length + local_c0) goto LAB_00127445;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00127445:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_68._M_dataplus._M_p);
  }
  local_e8 = &local_d8;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_d8 = *puVar4;
    uStack_d0 = puVar3[3];
  }
  else {
    local_d8 = *puVar4;
    local_e8 = (ulong *)*puVar3;
  }
  local_e0 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  ts<int>(&local_88,z);
  uVar5 = 0xf;
  if (local_e8 != &local_d8) {
    uVar5 = local_d8;
  }
  if (uVar5 < local_88._M_string_length + local_e0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar6 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_e0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_e8);
      goto LAB_00127516;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_88._M_dataplus._M_p);
LAB_00127516:
  local_a8 = &local_98;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (undefined8 *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void get_3(int x,int y,int z) { v_="get_3" + ts(x)+ts(y)+ts(z); }